

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O3

void dpf_cbnotnewline(block input)

{
  int i;
  ulong uVar1;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  
  uVar1 = 0;
  do {
    putchar(((CONCAT44(in_XMM0_Db,in_XMM0_Da) >> (uVar1 & 0x3f) & 1) != 0) + 0x30);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x40);
  uVar1 = 0;
  do {
    putchar(((CONCAT44(in_XMM0_Db,in_XMM0_Dc) >> (uVar1 & 0x3f) & 1) != 0) + 0x30);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x40);
  return;
}

Assistant:

void dpf_cbnotnewline(block input) {
    uint64_t *val = (uint64_t *) &input;

	_output_bit_to_bit(val[0]);
	_output_bit_to_bit(val[1]);
}